

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
RandomWordTestData(RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                   *this,char in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  __normal_iterator<signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_38
  ;
  const_iterator local_30;
  size_t local_28;
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *pRStack_10;
  char in_delim_local;
  RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  *this_local;
  
  local_28 = in_fixed_word_length;
  in_fixed_word_length_local = in_fixed_word_count;
  in_fixed_word_count_local._7_1_ = in_delim;
  pRStack_10 = this;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->m_delim);
  this->m_fixed_word_count = in_fixed_word_length_local;
  this->m_fixed_word_length = local_28;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector(&this->m_str);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::vector(&this->m_tokens);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_token_indexes);
  local_38._M_current =
       (char *)std::vector<signed_char,_std::allocator<signed_char>_>::end(&this->m_delim);
  __gnu_cxx::
  __normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>::
  __normal_iterator<signed_char*>
            ((__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>
              *)&local_30,&local_38);
  std::vector<signed_char,_std::allocator<signed_char>_>::insert
            (&this->m_delim,local_30,(value_type *)((long)&in_fixed_word_count_local + 7));
  populate(this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}